

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::InterfacePortHeaderSyntax::setChild
          (InterfacePortHeaderSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  DotMemberClauseSyntax *pDVar2;
  long in_RSI;
  long in_RDI;
  Token TVar3;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    TVar3 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffc8);
    local_20 = TVar3._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar3.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x49397a);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pDVar2 = (DotMemberClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x49398a);
      pDVar2 = SyntaxNode::as<slang::syntax::DotMemberClauseSyntax>(pSVar1);
    }
    *(DotMemberClauseSyntax **)(in_RDI + 0x28) = pDVar2;
  }
  return;
}

Assistant:

void InterfacePortHeaderSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: nameOrKeyword = child.token(); return;
        case 1: modport = child.node() ? &child.node()->as<DotMemberClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}